

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O0

int arkPrintRootMem(void *arkode_mem,FILE *outfile)

{
  FILE *in_RSI;
  long in_RDI;
  ARKodeMem ark_mem;
  int i;
  uint local_1c;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkPrintRootMem","arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    if (*(long *)(in_RDI + 0x280) != 0) {
      fprintf(in_RSI,"ark_nrtfn = %i\n",(ulong)*(uint *)(*(long *)(in_RDI + 0x280) + 8));
      fprintf(in_RSI,"ark_nge = %li\n",*(undefined8 *)(*(long *)(in_RDI + 0x280) + 0x68));
      if (*(long *)(*(long *)(in_RDI + 0x280) + 0x10) != 0) {
        for (local_1c = 0; (int)local_1c < *(int *)(*(long *)(in_RDI + 0x280) + 8);
            local_1c = local_1c + 1) {
          fprintf(in_RSI,"ark_iroots[%i] = %i\n",(ulong)local_1c,
                  (ulong)*(uint *)(*(long *)(*(long *)(in_RDI + 0x280) + 0x10) +
                                  (long)(int)local_1c * 4));
        }
      }
      if (*(long *)(*(long *)(in_RDI + 0x280) + 0x18) != 0) {
        for (local_1c = 0; (int)local_1c < *(int *)(*(long *)(in_RDI + 0x280) + 8);
            local_1c = local_1c + 1) {
          fprintf(in_RSI,"ark_rootdir[%i] = %i\n",(ulong)local_1c,
                  (ulong)*(uint *)(*(long *)(*(long *)(in_RDI + 0x280) + 0x18) +
                                  (long)(int)local_1c * 4));
        }
      }
      fprintf(in_RSI,"ark_taskc = %i\n",(ulong)*(uint *)(*(long *)(in_RDI + 0x280) + 0x60));
      fprintf(in_RSI,"ark_irfnd = %i\n",(ulong)*(uint *)(*(long *)(in_RDI + 0x280) + 100));
      fprintf(in_RSI,"ark_mxgnull = %i\n",(ulong)*(uint *)(*(long *)(in_RDI + 0x280) + 0x78));
      if (*(long *)(*(long *)(in_RDI + 0x280) + 0x70) != 0) {
        for (local_1c = 0; (int)local_1c < *(int *)(*(long *)(in_RDI + 0x280) + 8);
            local_1c = local_1c + 1) {
          fprintf(in_RSI,"ark_gactive[%i] = %i\n",(ulong)local_1c,
                  (ulong)*(uint *)(*(long *)(*(long *)(in_RDI + 0x280) + 0x70) +
                                  (long)(int)local_1c * 4));
        }
      }
      fprintf(in_RSI,"ark_tlo = %.16g\n",*(undefined8 *)(*(long *)(in_RDI + 0x280) + 0x20));
      fprintf(in_RSI,"ark_thi = %.16g\n",*(undefined8 *)(*(long *)(in_RDI + 0x280) + 0x28));
      fprintf(in_RSI,"ark_trout = %.16g\n",*(undefined8 *)(*(long *)(in_RDI + 0x280) + 0x30));
      if (*(long *)(*(long *)(in_RDI + 0x280) + 0x38) != 0) {
        for (local_1c = 0; (int)local_1c < *(int *)(*(long *)(in_RDI + 0x280) + 8);
            local_1c = local_1c + 1) {
          fprintf(in_RSI,"ark_glo[%i] = %.16g\n",
                  *(undefined8 *)
                   (*(long *)(*(long *)(in_RDI + 0x280) + 0x38) + (long)(int)local_1c * 8),
                  (ulong)local_1c);
        }
      }
      if (*(long *)(*(long *)(in_RDI + 0x280) + 0x40) != 0) {
        for (local_1c = 0; (int)local_1c < *(int *)(*(long *)(in_RDI + 0x280) + 8);
            local_1c = local_1c + 1) {
          fprintf(in_RSI,"ark_ghi[%i] = %.16g\n",
                  *(undefined8 *)
                   (*(long *)(*(long *)(in_RDI + 0x280) + 0x40) + (long)(int)local_1c * 8),
                  (ulong)local_1c);
        }
      }
      if (*(long *)(*(long *)(in_RDI + 0x280) + 0x48) != 0) {
        for (local_1c = 0; (int)local_1c < *(int *)(*(long *)(in_RDI + 0x280) + 8);
            local_1c = local_1c + 1) {
          fprintf(in_RSI,"ark_grout[%i] = %.16g\n",
                  *(undefined8 *)
                   (*(long *)(*(long *)(in_RDI + 0x280) + 0x48) + (long)(int)local_1c * 8),
                  (ulong)local_1c);
        }
      }
      fprintf(in_RSI,"ark_toutc = %.16g\n",*(undefined8 *)(*(long *)(in_RDI + 0x280) + 0x50));
      fprintf(in_RSI,"ark_ttol = %.16g\n",*(undefined8 *)(*(long *)(in_RDI + 0x280) + 0x58));
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkPrintRootMem(void* arkode_mem, FILE *outfile)
{
  int i;
  ARKodeMem ark_mem;
  if (arkode_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkPrintRootMem", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  if (ark_mem->root_mem != NULL) {
    fprintf(outfile, "ark_nrtfn = %i\n", ark_mem->root_mem->nrtfn);
    fprintf(outfile, "ark_nge = %li\n", ark_mem->root_mem->nge);
    if (ark_mem->root_mem->iroots != NULL)
      for (i=0; i<ark_mem->root_mem->nrtfn; i++)
        fprintf(outfile, "ark_iroots[%i] = %i\n", i, ark_mem->root_mem->iroots[i]);
    if (ark_mem->root_mem->rootdir != NULL)
      for (i=0; i<ark_mem->root_mem->nrtfn; i++)
        fprintf(outfile, "ark_rootdir[%i] = %i\n", i, ark_mem->root_mem->rootdir[i]);
    fprintf(outfile, "ark_taskc = %i\n", ark_mem->root_mem->taskc);
    fprintf(outfile, "ark_irfnd = %i\n", ark_mem->root_mem->irfnd);
    fprintf(outfile, "ark_mxgnull = %i\n", ark_mem->root_mem->mxgnull);
    if (ark_mem->root_mem->gactive != NULL)
      for (i=0; i<ark_mem->root_mem->nrtfn; i++)
        fprintf(outfile, "ark_gactive[%i] = %i\n", i, ark_mem->root_mem->gactive[i]);
    fprintf(outfile, "ark_tlo = %"RSYM"\n", ark_mem->root_mem->tlo);
    fprintf(outfile, "ark_thi = %"RSYM"\n", ark_mem->root_mem->thi);
    fprintf(outfile, "ark_trout = %"RSYM"\n", ark_mem->root_mem->trout);
    if (ark_mem->root_mem->glo != NULL)
      for (i=0; i<ark_mem->root_mem->nrtfn; i++)
        fprintf(outfile, "ark_glo[%i] = %"RSYM"\n", i, ark_mem->root_mem->glo[i]);
    if (ark_mem->root_mem->ghi != NULL)
      for (i=0; i<ark_mem->root_mem->nrtfn; i++)
        fprintf(outfile, "ark_ghi[%i] = %"RSYM"\n", i, ark_mem->root_mem->ghi[i]);
    if (ark_mem->root_mem->grout != NULL)
      for (i=0; i<ark_mem->root_mem->nrtfn; i++)
        fprintf(outfile, "ark_grout[%i] = %"RSYM"\n", i, ark_mem->root_mem->grout[i]);
    fprintf(outfile, "ark_toutc = %"RSYM"\n", ark_mem->root_mem->toutc);
    fprintf(outfile, "ark_ttol = %"RSYM"\n", ark_mem->root_mem->ttol);
  }
  return(ARK_SUCCESS);
}